

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O2

int nn_bus_send(nn_sockbase *self,nn_msg *msg)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  
  sVar3 = nn_chunkref_size(&msg->sphdr);
  if (sVar3 == 0) {
    iVar1 = nn_xbus_send(self,msg);
    iVar2 = 0;
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar4 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/bus/bus.c"
              ,0x5e);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  else {
    iVar2 = -0x16;
  }
  return iVar2;
}

Assistant:

static int nn_bus_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_bus *bus;

    bus = nn_cont (self, struct nn_bus, xbus.sockbase);

    /*  Check for malformed messages. */
    if (nn_chunkref_size (&msg->sphdr))
        return -EINVAL;

    /*  Send the message. */
    rc = nn_xbus_send (&bus->xbus.sockbase, msg);
    errnum_assert (rc == 0, -rc);

    return 0;
}